

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

RK_S32 mpp_av1_read_unsigned
                 (BitReadCtx_t *gbc,RK_S32 width,char *name,RK_U32 *write_to,RK_U32 range_min,
                 RK_U32 range_max)

{
  RK_S32 RVar1;
  MPP_RET MVar2;
  uint local_40;
  uint local_3c;
  RK_U32 _out;
  RK_U32 value;
  RK_U32 range_max_local;
  RK_U32 range_min_local;
  RK_U32 *write_to_local;
  char *name_local;
  BitReadCtx_t *pBStack_18;
  RK_S32 width_local;
  BitReadCtx_t *gbc_local;
  
  _out = range_max;
  value = range_min;
  _range_max_local = write_to;
  write_to_local = (RK_U32 *)name;
  name_local._4_4_ = width;
  pBStack_18 = gbc;
  if (((width < 1) || (0x20 < width)) &&
     (_mpp_log_l(2,"av1d_cbs","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "width > 0 && width <= 32","mpp_av1_read_unsigned",0xb0),
     (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  RVar1 = mpp_get_bits_left(pBStack_18);
  if (RVar1 < name_local._4_4_) {
    _mpp_log_l(2,"av1d_cbs","Invalid value at %s: bitstream ended.\n","mpp_av1_read_unsigned",
               write_to_local);
    gbc_local._4_4_ = -1;
  }
  else {
    MVar2 = mpp_read_longbits(pBStack_18,name_local._4_4_,&local_40);
    pBStack_18->ret = MVar2;
    if (pBStack_18->ret == MPP_OK) {
      local_3c = local_40;
      if ((local_40 < value) || (_out < local_40)) {
        _mpp_log_l(2,"av1d_cbs","%s out of range: %d, but must be in [%d,%d].\n",
                   "mpp_av1_read_unsigned",write_to_local,(ulong)local_40,value,_out);
        gbc_local._4_4_ = -1;
      }
      else {
        *_range_max_local = local_40;
        gbc_local._4_4_ = 0;
      }
    }
    else {
      gbc_local._4_4_ = -1;
    }
  }
  return gbc_local._4_4_;
}

Assistant:

RK_S32 mpp_av1_read_unsigned(BitReadCtx_t *gbc,
                             RK_S32 width, const char *name,
                             RK_U32 *write_to, RK_U32 range_min,
                             RK_U32 range_max)
{
    RK_U32 value;

    mpp_assert(width > 0 && width <= 32);

    if (mpp_get_bits_left(gbc) < width) {
        mpp_err_f("Invalid value at "
                  "%s: bitstream ended.\n", name);
        return MPP_NOK;
    }

    READ_BITS_LONG(gbc, width, &value);

    if (value < range_min || value > range_max) {
        mpp_err_f("%s out of range: "
                  "%d, but must be in [%d,%d].\n",
                  name, value, range_min, range_max);
        return MPP_NOK;
    }

    *write_to = value;
    return 0;

__bitread_error:
    return MPP_NOK;

}